

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O2

Property *
Rml::ElementStyle::GetProperty
          (PropertyId id,Element *element,PropertyDictionary *inline_properties,
          ElementDefinition *definition)

{
  bool bVar1;
  Property *pPVar2;
  PropertyDefinition *this;
  ElementStyle *this_00;
  
  pPVar2 = GetLocalProperty(id,inline_properties,definition);
  if (pPVar2 == (Property *)0x0) {
    this = StyleSheetSpecification::GetProperty(id);
    if (this == (PropertyDefinition *)0x0) {
      pPVar2 = (Property *)0x0;
    }
    else {
      bVar1 = PropertyDefinition::IsInherited(this);
      if (!bVar1) {
LAB_00293a2e:
        pPVar2 = PropertyDefinition::GetDefaultValue(this);
        return pPVar2;
      }
      do {
        element = Element::GetParentNode(element);
        if (element == (Element *)0x0) goto LAB_00293a2e;
        this_00 = Element::GetStyle(element);
        pPVar2 = GetLocalProperty(this_00,id);
      } while (pPVar2 == (Property *)0x0);
    }
  }
  return pPVar2;
}

Assistant:

const Property* ElementStyle::GetProperty(PropertyId id, const Element* element, const PropertyDictionary& inline_properties,
	const ElementDefinition* definition)
{
	const Property* local_property = GetLocalProperty(id, inline_properties, definition);
	if (local_property)
		return local_property;

	// Fetch the property specification.
	const PropertyDefinition* property = StyleSheetSpecification::GetProperty(id);
	if (!property)
		return nullptr;

	// If we can inherit this property, return our parent's property.
	if (property->IsInherited())
	{
		Element* parent = element->GetParentNode();
		while (parent)
		{
			const Property* parent_property = parent->GetStyle()->GetLocalProperty(id);
			if (parent_property)
				return parent_property;

			parent = parent->GetParentNode();
		}
	}

	// No property available! Return the default value.
	return property->GetDefaultValue();
}